

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestinitiatorFixtureDisconnect_ResetOnDisconnect::
TestinitiatorFixtureDisconnect_ResetOnDisconnect
          (TestinitiatorFixtureDisconnect_ResetOnDisconnect *this)

{
  char *suiteName;
  TestinitiatorFixtureDisconnect_ResetOnDisconnect *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"Disconnect_ResetOnDisconnect",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x81d);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestinitiatorFixtureDisconnect_ResetOnDisconnect_0045b230;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, Disconnect_ResetOnDisconnect) {
  startLoggedOn();

  object->setResetOnDisconnect(true);

  object->setNextSenderMsgSeqNum(20);
  object->setNextTargetMsgSeqNum(20);

  object->disconnect();

  CHECK_EQUAL(1, object->getExpectedSenderNum());
  CHECK_EQUAL(1, object->getExpectedTargetNum());

}